

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O0

Result<wasm::Name> * __thiscall
wasm::WATParser::ParseDefsCtx::getFuncFromIdx
          (Result<wasm::Name> *__return_storage_ptr__,ParseDefsCtx *this,uint32_t idx)

{
  size_type sVar1;
  reference this_00;
  pointer u;
  allocator<char> local_61;
  string local_60;
  Err local_40;
  uint local_1c;
  ParseDefsCtx *pPStack_18;
  uint32_t idx_local;
  ParseDefsCtx *this_local;
  
  local_1c = idx;
  pPStack_18 = this;
  this_local = (ParseDefsCtx *)__return_storage_ptr__;
  sVar1 = std::
          vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
          ::size(&this->wasm->functions);
  if (idx < sVar1) {
    this_00 = std::
              vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ::operator[](&this->wasm->functions,(ulong)local_1c);
    u = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->(this_00);
    Result<wasm::Name>::Result<wasm::Name&>(__return_storage_ptr__,(Name *)u);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"function index out of bounds",&local_61);
    Lexer::err(&local_40,&this->in,&local_60);
    Result<wasm::Name>::Result(__return_storage_ptr__,&local_40);
    wasm::Err::~Err(&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<Name> getFuncFromIdx(uint32_t idx) {
    if (idx >= wasm.functions.size()) {
      return in.err("function index out of bounds");
    }
    return wasm.functions[idx]->name;
  }